

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall
ChainstateManager::UpdateUncommittedBlockStructures
          (ChainstateManager *this,CBlock *block,CBlockIndex *pindexPrev)

{
  long lVar1;
  CTransaction *tx_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined1 local_70 [16];
  CMutableTransaction tx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = GetWitnessCommitmentIndex(block);
  if (UpdateUncommittedBlockStructures(CBlock&,CBlockIndex_const*)::nonce == '\0') {
    iVar4 = __cxa_guard_acquire(&UpdateUncommittedBlockStructures(CBlock&,CBlockIndex_const*)::nonce
                               );
    if (iVar4 != 0) {
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&UpdateUncommittedBlockStructures::nonce,0x20,(value_type_conflict3 *)&tx,
                 (allocator_type *)local_70);
      __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                   &UpdateUncommittedBlockStructures::nonce,&__dso_handle);
      __cxa_guard_release(&UpdateUncommittedBlockStructures(CBlock&,CBlockIndex_const*)::nonce);
    }
  }
  if (iVar3 != -1) {
    bVar2 = DeploymentActiveAfter<Consensus::BuriedDeployment>(pindexPrev,this,DEPLOYMENT_SEGWIT);
    if ((bVar2) &&
       (tx_00 = (((block->vtx).
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
       tx_00->m_has_witness == false)) {
      CMutableTransaction::CMutableTransaction(&tx,tx_00);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::resize((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)(CONCAT71(tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_) + 0x50),1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)
                  (CONCAT71(tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_) + 0x50),
                 &UpdateUncommittedBlockStructures::nonce);
      std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)local_70);
      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&((block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
      CMutableTransaction::~CMutableTransaction(&tx);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ChainstateManager::UpdateUncommittedBlockStructures(CBlock& block, const CBlockIndex* pindexPrev) const
{
    int commitpos = GetWitnessCommitmentIndex(block);
    static const std::vector<unsigned char> nonce(32, 0x00);
    if (commitpos != NO_WITNESS_COMMITMENT && DeploymentActiveAfter(pindexPrev, *this, Consensus::DEPLOYMENT_SEGWIT) && !block.vtx[0]->HasWitness()) {
        CMutableTransaction tx(*block.vtx[0]);
        tx.vin[0].scriptWitness.stack.resize(1);
        tx.vin[0].scriptWitness.stack[0] = nonce;
        block.vtx[0] = MakeTransactionRef(std::move(tx));
    }
}